

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strife_sbar.cpp
# Opt level: O2

void __thiscall FHealthBar::FHealthBar(FHealthBar *this)

{
  BYTE BVar1;
  byte *pbVar2;
  long lVar3;
  
  FTexture::FTexture(&this->super_FTexture,(char *)0x0,-1);
  (this->super_FTexture)._vptr_FTexture = (_func_int **)&PTR__FTexture_006ffb00;
  this->VialLevel = 0;
  this->NeedRefresh = false;
  (this->super_FTexture).Width = 200;
  (this->super_FTexture).Height = 2;
  (this->super_FTexture).WidthBits = '\b';
  (this->super_FTexture).HeightBits = '\x01';
  (this->super_FTexture).WidthMask = 0xff;
  pbVar2 = FHealthBar::rgbs + 2;
  for (lVar3 = 0x1e4; lVar3 != 0x1ec; lVar3 = lVar3 + 1) {
    BVar1 = FColorMatcher::Pick(&ColorMatcher,(uint)pbVar2[-2],(uint)pbVar2[-1],(uint)*pbVar2);
    *(BYTE *)((long)&(this->super_FTexture)._vptr_FTexture + lVar3) = BVar1;
    pbVar2 = pbVar2 + 3;
  }
  return;
}

Assistant:

FHealthBar::FHealthBar ()
: VialLevel(0), NeedRefresh(false)
{
	int i;

	static const BYTE rgbs[8*3] =
	{
		180, 228, 128,	// light green
		128, 180, 80,	// dark green

		196, 204, 252,	// light blue
		148, 152, 200,	// dark blue

		224, 188, 0,	// light gold
		208, 128, 0,	// dark gold

		216, 44,  44,	// light red
		172, 28,  28	// dark red
	};

	Width = 200;
	Height = 2;
	WidthBits = 8;
	HeightBits = 1;
	WidthMask = 255;

	for (i = 0; i < 8; ++i)
	{
		Colors[i] = ColorMatcher.Pick (rgbs[i*3], rgbs[i*3+1], rgbs[i*3+2]);
	}
}